

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbTruncate(sqlite3_file *pFile,sqlite_int64 size)

{
  sqlite3_io_methods *p_00;
  int local_24;
  int rc;
  MemStore *p;
  sqlite_int64 size_local;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  local_24 = 0;
  memdbEnter((MemStore *)p_00);
  if (*(long *)p_00 < size) {
    local_24 = 0xb;
  }
  else {
    *(sqlite_int64 *)p_00 = size;
  }
  memdbLeave((MemStore *)p_00);
  return local_24;
}

Assistant:

static int memdbTruncate(sqlite3_file *pFile, sqlite_int64 size){
  MemStore *p = ((MemFile*)pFile)->pStore;
  int rc = SQLITE_OK;
  memdbEnter(p);
  if( size>p->sz ){
    /* This can only happen with a corrupt wal mode db */
    rc = SQLITE_CORRUPT;
  }else{
    p->sz = size;
  }
  memdbLeave(p);
  return rc;
}